

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O2

ares_status_t
ares_requeue_query(ares_query_t *query,ares_timeval_t *now,ares_status_t status,
                  ares_bool_t inc_try_count,ares_dns_record_t *dnsrec,ares_array_t **requeue)

{
  ares_channel_t *channel;
  size_t sVar1;
  ares_status_t aVar2;
  size_t sVar3;
  ulong uVar4;
  
  channel = query->channel;
  sVar3 = ares_slist_len(channel->servers);
  sVar1 = channel->tries;
  ares_query_remove_from_conn(query);
  if (status != ARES_SUCCESS) {
    query->error_status = status;
  }
  uVar4 = query->try_count;
  if (inc_try_count != ARES_FALSE) {
    uVar4 = uVar4 + 1;
    query->try_count = uVar4;
  }
  if ((uVar4 < sVar3 * sVar1) && (query->no_retries == ARES_FALSE)) {
    if (requeue != (ares_array_t **)0x0) {
      aVar2 = ares_append_requeue(requeue,query,(ares_server_t *)0x0);
      return aVar2;
    }
    aVar2 = ares_send_query((ares_server_t *)0x0,query,now);
    return aVar2;
  }
  aVar2 = query->error_status;
  if (aVar2 == ARES_SUCCESS) {
    aVar2 = ARES_ETIMEOUT;
    query->error_status = ARES_ETIMEOUT;
  }
  end_query(channel,(ares_server_t *)0x0,query,aVar2,dnsrec);
  return ARES_ETIMEOUT;
}

Assistant:

ares_status_t ares_requeue_query(ares_query_t *query, const ares_timeval_t *now,
                                 ares_status_t            status,
                                 ares_bool_t              inc_try_count,
                                 const ares_dns_record_t *dnsrec,
                                 ares_array_t           **requeue)
{
  ares_channel_t *channel   = query->channel;
  size_t          max_tries = ares_slist_len(channel->servers) * channel->tries;

  ares_query_remove_from_conn(query);

  if (status != ARES_SUCCESS) {
    query->error_status = status;
  }

  if (inc_try_count) {
    query->try_count++;
  }

  if (query->try_count < max_tries && !query->no_retries) {
    if (requeue != NULL) {
      return ares_append_requeue(requeue, query, NULL);
    }
    return ares_send_query(NULL, query, now);
  }

  /* If we are here, all attempts to perform query failed. */
  if (query->error_status == ARES_SUCCESS) {
    query->error_status = ARES_ETIMEOUT;
  }

  end_query(channel, NULL, query, query->error_status, dnsrec);
  return ARES_ETIMEOUT;
}